

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

bool __thiscall
llama_model_loader::get_key<bool>(llama_model_loader *this,llm_kv kid,bool *result,bool required)

{
  bool bVar1;
  undefined8 in_RDI;
  undefined1 required_00;
  bool *unaff_retaddr;
  string *in_stack_00000008;
  llama_model_loader *in_stack_00000010;
  string local_40 [4];
  llm_kv in_stack_ffffffffffffffc4;
  LLM_KV *in_stack_ffffffffffffffc8;
  
  required_00 = (undefined1)((ulong)in_RDI >> 0x38);
  LLM_KV::operator()[abi_cxx11_(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  bVar1 = get_key<bool>(in_stack_00000010,in_stack_00000008,unaff_retaddr,(bool)required_00);
  std::__cxx11::string::~string(local_40);
  return bVar1;
}

Assistant:

bool llama_model_loader::get_key(enum llm_kv kid, T & result, bool required) {
        return get_key(llm_kv(kid), result, required);
    }